

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_crc.cc
# Opt level: O1

void absl::lts_20250127::cord_internal::CordRepCrc::Destroy(CordRepCrc *node)

{
  RefcountAndFlags *pRVar1;
  uint uVar2;
  CordRep *rep;
  
  rep = node->child;
  if (rep != (CordRep *)0x0) {
    LOCK();
    pRVar1 = &rep->refcount;
    uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar2 & 1) == 0 && (int)uVar2 < 1) {
      __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0xac,
                    "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
    }
    if (uVar2 == 2) {
      CordRep::Destroy(rep);
    }
  }
  if (node != (CordRepCrc *)0x0) {
    crc_internal::CrcCordState::~CrcCordState(&node->crc_cord_state);
    operator_delete(node,0x20);
    return;
  }
  return;
}

Assistant:

void CordRepCrc::Destroy(CordRepCrc* node) {
  if (node->child != nullptr) {
    CordRep::Unref(node->child);
  }
  delete node;
}